

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  short sVar3;
  stbi__uint32 b;
  stbi_uc asVar4 [4];
  stbi_uc asVar5 [4];
  undefined8 uVar6;
  stbi_uc sVar7;
  byte bVar8;
  uchar uVar9;
  int iVar10;
  stbi__uint32 sVar11;
  uint uVar12;
  int iVar13;
  stbi__jpeg *psVar14;
  long lVar15;
  stbi__uint16 *data_00;
  stbi__context *psVar16;
  uchar *data_01;
  void *pvVar17;
  code *pcVar18;
  stbi__context *psVar19;
  float *data_02;
  stbi_uc *psVar20;
  byte *pbVar21;
  long lVar22;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar23;
  uint uVar24;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar25;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong extraout_RDX_14;
  ulong extraout_RDX_15;
  ulong uVar26;
  ulong uVar27;
  uchar *puVar28;
  stbi_uc *psVar29;
  stbi_uc *psVar30;
  short *psVar31;
  long lVar32;
  undefined7 uVar33;
  int iVar34;
  int iVar35;
  undefined4 in_register_00000084;
  ulong uVar36;
  int iVar37;
  stbi__result_info *ri_00;
  ulong uVar38;
  int iVar39;
  int iVar40;
  stbi__uint16 *psVar41;
  stbi_uc (*pasVar42) [4];
  int *piVar43;
  short sVar44;
  uint uVar45;
  bool bVar46;
  undefined1 auVar47 [16];
  stbi_uc *coutput [4];
  short data [64];
  int local_8978;
  uint local_8960;
  ulong local_8948;
  int local_893c;
  uint local_8930;
  uint local_8924;
  uint local_890c;
  stbi__bmp_data local_8908;
  int *local_88e8;
  int *local_88e0;
  undefined8 local_88d8;
  uint local_88cc;
  stbi_uc *local_88c8;
  ulong local_88c0;
  stbi__uint32 local_88b4;
  uint local_88b0;
  int local_88ac;
  stbi__gif local_88a8;
  
  psVar30 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri_00 = ri;
  local_88e8 = comp;
  psVar14 = (stbi__jpeg *)malloc(0x4888);
  psVar14->s = s;
  psVar14->idct_block_kernel = stbi__idct_simd;
  psVar14->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar14->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar14->jfif = 0;
  psVar14->app14_color_transform = -1;
  psVar14->marker = 0xff;
  sVar7 = stbi__get_marker(psVar14);
  if (sVar7 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar14);
  if (sVar7 == 0xd8) {
    psVar14 = (stbi__jpeg *)malloc(0x4888);
    psVar14->s = s;
    psVar14->idct_block_kernel = stbi__idct_simd;
    psVar14->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar14->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      paVar1 = psVar14->img_comp;
      lVar15 = 0x46d8;
      do {
        psVar30 = psVar14->huff_dc[0].fast + lVar15 + -8;
        psVar30[0] = '\0';
        psVar30[1] = '\0';
        psVar30[2] = '\0';
        psVar30[3] = '\0';
        psVar30[4] = '\0';
        psVar30[5] = '\0';
        psVar30[6] = '\0';
        psVar30[7] = '\0';
        psVar30[8] = '\0';
        psVar30[9] = '\0';
        psVar30[10] = '\0';
        psVar30[0xb] = '\0';
        psVar30[0xc] = '\0';
        psVar30[0xd] = '\0';
        psVar30[0xe] = '\0';
        psVar30[0xf] = '\0';
        lVar15 = lVar15 + 0x60;
      } while (lVar15 != 0x4858);
      psVar14->restart_interval = 0;
      iVar10 = stbi__decode_jpeg_header(psVar14,0);
      uVar45 = extraout_EDX;
      if (iVar10 != 0) {
        bVar8 = stbi__get_marker(psVar14);
        local_88e0 = psVar14->huff_ac[0].delta + 9;
LAB_0014d1fe:
        if (bVar8 == 0xda) {
          iVar10 = stbi__get16be(psVar14->s);
          psVar16 = psVar14->s;
          pbVar21 = psVar16->img_buffer;
          paVar25 = extraout_RDX_00;
          if (pbVar21 < psVar16->img_buffer_end) {
LAB_0014d2de:
            psVar16->img_buffer = pbVar21 + 1;
            bVar8 = *pbVar21;
          }
          else {
            if (psVar16->read_from_callbacks != 0) {
              psVar30 = psVar16->buffer_start;
              iVar40 = (*(psVar16->io).read)(psVar16->io_user_data,(char *)psVar30,psVar16->buflen);
              if (iVar40 == 0) {
                psVar16->read_from_callbacks = 0;
                psVar16->img_buffer = psVar30;
                psVar16->img_buffer_end = psVar16->buffer_start + 1;
                psVar16->buffer_start[0] = '\0';
              }
              else {
                psVar16->img_buffer = psVar30;
                psVar16->img_buffer_end = psVar30 + iVar40;
              }
              pbVar21 = psVar16->img_buffer;
              paVar25 = extraout_RDX_01;
              goto LAB_0014d2de;
            }
            bVar8 = 0;
          }
          psVar14->scan_n = (uint)bVar8;
          if ((0xfb < (byte)(bVar8 - 5)) && ((int)(uint)bVar8 <= psVar14->s->img_n)) {
            if (iVar10 != (uint)bVar8 * 2 + 6) {
              stbi__g_failure_reason = "bad SOS len";
              goto LAB_0014f74d;
            }
            if (bVar8 != 0) {
              lVar15 = 0;
              do {
                psVar16 = psVar14->s;
                pbVar21 = psVar16->img_buffer;
                if (pbVar21 < psVar16->img_buffer_end) {
LAB_0014d399:
                  psVar16->img_buffer = pbVar21 + 1;
                  uVar23 = (uint)*pbVar21;
                }
                else {
                  if (psVar16->read_from_callbacks != 0) {
                    psVar30 = psVar16->buffer_start;
                    iVar10 = (*(psVar16->io).read)
                                       (psVar16->io_user_data,(char *)psVar30,psVar16->buflen);
                    if (iVar10 == 0) {
                      psVar16->read_from_callbacks = 0;
                      psVar16->img_buffer = psVar30;
                      psVar16->img_buffer_end = psVar16->buffer_start + 1;
                      psVar16->buffer_start[0] = '\0';
                    }
                    else {
                      psVar16->img_buffer = psVar30;
                      psVar16->img_buffer_end = psVar30 + iVar10;
                    }
                    pbVar21 = psVar16->img_buffer;
                    goto LAB_0014d399;
                  }
                  uVar23 = 0;
                }
                psVar16 = psVar14->s;
                pbVar21 = psVar16->img_buffer;
                if (pbVar21 < psVar16->img_buffer_end) {
LAB_0014d418:
                  psVar16->img_buffer = pbVar21 + 1;
                  bVar8 = *pbVar21;
                }
                else {
                  if (psVar16->read_from_callbacks != 0) {
                    psVar30 = psVar16->buffer_start;
                    iVar10 = (*(psVar16->io).read)
                                       (psVar16->io_user_data,(char *)psVar30,psVar16->buflen);
                    if (iVar10 == 0) {
                      psVar16->read_from_callbacks = 0;
                      psVar16->img_buffer = psVar30;
                      psVar16->img_buffer_end = psVar16->buffer_start + 1;
                      psVar16->buffer_start[0] = '\0';
                    }
                    else {
                      psVar16->img_buffer = psVar30;
                      psVar16->img_buffer_end = psVar30 + iVar10;
                    }
                    pbVar21 = psVar16->img_buffer;
                    goto LAB_0014d418;
                  }
                  bVar8 = 0;
                }
                uVar45 = psVar14->s->img_n;
                if ((int)uVar45 < 1) {
                  uVar26 = 0;
                }
                else {
                  uVar26 = 0;
                  paVar25 = paVar1;
                  do {
                    if (paVar25->id == uVar23) goto LAB_0014d450;
                    uVar26 = uVar26 + 1;
                    paVar25 = paVar25 + 1;
                  } while (uVar45 != uVar26);
                  uVar26 = (ulong)uVar45;
                }
LAB_0014d450:
                if ((uint)uVar26 == uVar45) goto LAB_0014f754;
                uVar27 = uVar26 & 0xffffffff;
                paVar25 = (anon_struct_96_18_0d0905d3 *)(uVar27 * 0x60);
                psVar14->img_comp[uVar27].hd = (uint)(bVar8 >> 4);
                if (0x3f < bVar8) {
                  stbi__g_failure_reason = "bad DC huff";
                  goto LAB_0014f74d;
                }
                paVar25 = paVar1 + uVar27;
                paVar25->ha = bVar8 & 0xf;
                if (3 < (bVar8 & 0xf)) {
                  stbi__g_failure_reason = "bad AC huff";
                  goto LAB_0014f74d;
                }
                psVar14->order[lVar15] = (uint)uVar26;
                lVar15 = lVar15 + 1;
              } while (lVar15 < psVar14->scan_n);
            }
            psVar16 = psVar14->s;
            pbVar21 = psVar16->img_buffer;
            if (pbVar21 < psVar16->img_buffer_end) {
LAB_0014d516:
              psVar16->img_buffer = pbVar21 + 1;
              uVar45 = (uint)*pbVar21;
            }
            else {
              if (psVar16->read_from_callbacks != 0) {
                psVar30 = psVar16->buffer_start;
                iVar10 = (*(psVar16->io).read)
                                   (psVar16->io_user_data,(char *)psVar30,psVar16->buflen);
                if (iVar10 == 0) {
                  psVar16->read_from_callbacks = 0;
                  psVar16->img_buffer = psVar30;
                  psVar16->img_buffer_end = psVar16->buffer_start + 1;
                  psVar16->buffer_start[0] = '\0';
                }
                else {
                  psVar16->img_buffer = psVar30;
                  psVar16->img_buffer_end = psVar30 + iVar10;
                }
                pbVar21 = psVar16->img_buffer;
                goto LAB_0014d516;
              }
              uVar45 = 0;
            }
            psVar14->spec_start = uVar45;
            psVar16 = psVar14->s;
            pbVar21 = psVar16->img_buffer;
            if (pbVar21 < psVar16->img_buffer_end) {
LAB_0014d59c:
              psVar16->img_buffer = pbVar21 + 1;
              uVar45 = (uint)*pbVar21;
            }
            else {
              if (psVar16->read_from_callbacks != 0) {
                psVar30 = psVar16->buffer_start;
                iVar10 = (*(psVar16->io).read)
                                   (psVar16->io_user_data,(char *)psVar30,psVar16->buflen);
                if (iVar10 == 0) {
                  psVar16->read_from_callbacks = 0;
                  psVar16->img_buffer = psVar30;
                  psVar16->img_buffer_end = psVar16->buffer_start + 1;
                  psVar16->buffer_start[0] = '\0';
                }
                else {
                  psVar16->img_buffer = psVar30;
                  psVar16->img_buffer_end = psVar30 + iVar10;
                }
                pbVar21 = psVar16->img_buffer;
                goto LAB_0014d59c;
              }
              uVar45 = 0;
            }
            psVar14->spec_end = uVar45;
            psVar16 = psVar14->s;
            pbVar21 = psVar16->img_buffer;
            if (pbVar21 < psVar16->img_buffer_end) {
LAB_0014d622:
              psVar16->img_buffer = pbVar21 + 1;
              bVar8 = *pbVar21;
            }
            else {
              if (psVar16->read_from_callbacks != 0) {
                psVar30 = psVar16->buffer_start;
                iVar10 = (*(psVar16->io).read)
                                   (psVar16->io_user_data,(char *)psVar30,psVar16->buflen);
                if (iVar10 == 0) {
                  psVar16->read_from_callbacks = 0;
                  psVar16->img_buffer = psVar30;
                  psVar16->img_buffer_end = psVar16->buffer_start + 1;
                  psVar16->buffer_start[0] = '\0';
                }
                else {
                  psVar16->img_buffer = psVar30;
                  psVar16->img_buffer_end = psVar30 + iVar10;
                }
                pbVar21 = psVar16->img_buffer;
                goto LAB_0014d622;
              }
              bVar8 = 0;
            }
            psVar14->succ_high = (uint)(bVar8 >> 4);
            uVar45 = bVar8 & 0xf;
            paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar45;
            psVar14->succ_low = uVar45;
            iVar10 = psVar14->progressive;
            iVar40 = psVar14->spec_start;
            if (iVar10 == 0) {
              if (((iVar40 != 0) || (0xf < bVar8)) || ((bVar8 & 0xf) != 0)) goto LAB_0014ecbb;
              psVar14->spec_end = 0x3f;
            }
            else if (((0x3f < iVar40) || (0x3f < psVar14->spec_end)) ||
                    ((psVar14->spec_end < iVar40 || ((0xdf < bVar8 || (0xd < uVar45)))))) {
LAB_0014ecbb:
              stbi__g_failure_reason = "bad SOS";
              goto LAB_0014f74d;
            }
            iVar40 = psVar14->scan_n;
            uVar26 = (ulong)(uint)psVar14->restart_interval;
            if (psVar14->restart_interval == 0) {
              uVar26 = 0x7fffffff;
            }
            psVar14->code_buffer = 0;
            psVar14->code_bits = 0;
            psVar14->nomore = 0;
            psVar14->img_comp[3].dc_pred = 0;
            psVar14->img_comp[2].dc_pred = 0;
            psVar14->img_comp[1].dc_pred = 0;
            psVar14->img_comp[0].dc_pred = 0;
            psVar14->marker = 0xff;
            uVar45 = (uint)uVar26;
            psVar14->todo = uVar45;
            psVar14->eob_run = 0;
            if (iVar10 == 0) {
              if (iVar40 == 1) {
                iVar40 = psVar14->order[0];
                uVar23 = psVar14->img_comp[iVar40].y + 7 >> 3;
                local_8948 = (ulong)uVar23;
                if (0 < (int)uVar23) {
                  uVar12 = paVar1[iVar40].x + 7 >> 3;
                  iVar37 = 0;
                  uVar24 = 0;
                  iVar10 = local_8978;
                  do {
                    if (0 < (int)uVar12) {
                      lVar15 = 0;
                      do {
                        iVar39 = stbi__jpeg_decode_block
                                           (psVar14,(short *)&local_88a8,
                                            (stbi__huffman *)
                                            psVar14->huff_dc[paVar1[iVar40].hd].fast,
                                            (stbi__huffman *)
                                            psVar14->huff_ac[paVar1[iVar40].ha].fast,
                                            psVar14->fast_ac[paVar1[iVar40].ha],iVar40,
                                            psVar14->dequant[paVar1[iVar40].tq]);
                        if (iVar39 == 0) {
                          bVar46 = false;
                          iVar10 = 0;
                          uVar26 = extraout_RDX_07;
                        }
                        else {
                          (*psVar14->idct_block_kernel)
                                    (paVar1[iVar40].data + lVar15 + iVar37 * paVar1[iVar40].w2,
                                     paVar1[iVar40].w2,(short *)&local_88a8);
                          iVar39 = psVar14->todo;
                          psVar14->todo = iVar39 + -1;
                          bVar46 = true;
                          uVar26 = extraout_RDX_08;
                          if (iVar39 < 2) {
                            if (psVar14->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar14);
                              uVar26 = extraout_RDX_09;
                            }
                            if ((psVar14->marker & 0xf8) == 0xd0) {
                              psVar14->code_buffer = 0;
                              psVar14->code_bits = 0;
                              psVar14->nomore = 0;
                              psVar14->img_comp[3].dc_pred = 0;
                              psVar14->img_comp[2].dc_pred = 0;
                              psVar14->img_comp[1].dc_pred = 0;
                              psVar14->img_comp[0].dc_pred = 0;
                              psVar14->marker = 0xff;
                              iVar39 = psVar14->restart_interval;
                              uVar26 = 0x7fffffff;
                              if (iVar39 == 0) {
                                iVar39 = 0x7fffffff;
                              }
                              psVar14->todo = iVar39;
                              psVar14->eob_run = 0;
                            }
                            else {
                              iVar10 = 1;
                              bVar46 = false;
                            }
                          }
                        }
                        uVar45 = (uint)uVar26;
                        local_8978 = iVar10;
                        if (!bVar46) goto LAB_0014e6a2;
                        lVar15 = lVar15 + 8;
                      } while ((ulong)uVar12 * 8 != lVar15);
                    }
                    uVar45 = (uint)uVar26;
                    uVar24 = uVar24 + 1;
                    iVar37 = iVar37 + 8;
                    local_8978 = iVar10;
                  } while (uVar24 != uVar23);
                }
LAB_0014e433:
                iVar10 = 1;
              }
              else {
                iVar10 = 1;
                if (0 < psVar14->img_mcu_y) {
                  iVar40 = 0;
                  do {
                    if (0 < psVar14->img_mcu_x) {
                      local_8978 = 0;
                      do {
                        if (0 < psVar14->scan_n) {
                          uVar27 = 0;
                          do {
                            local_8948 = uVar27;
                            iVar10 = psVar14->order[local_8948];
                            if (0 < psVar14->img_comp[iVar10].v) {
                              iVar37 = 0;
                              bVar46 = true;
                              do {
                                iVar39 = paVar1[iVar10].h;
                                if (0 < iVar39) {
                                  iVar34 = 0;
                                  do {
                                    iVar35 = paVar1[iVar10].v;
                                    iVar13 = stbi__jpeg_decode_block
                                                       (psVar14,(short *)&local_88a8,
                                                        (stbi__huffman *)
                                                        psVar14->huff_dc[paVar1[iVar10].hd].fast,
                                                        (stbi__huffman *)
                                                        psVar14->huff_ac[paVar1[iVar10].ha].fast,
                                                        psVar14->fast_ac[paVar1[iVar10].ha],iVar10,
                                                        psVar14->dequant[paVar1[iVar10].tq]);
                                    uVar45 = (uint)extraout_RDX_11;
                                    if (iVar13 == 0) {
                                      uVar26 = extraout_RDX_11;
                                      if (bVar46) goto LAB_0014e68a;
                                      goto LAB_0014e597;
                                    }
                                    (*psVar14->idct_block_kernel)
                                              (paVar1[iVar10].data +
                                               (long)((iVar39 * local_8978 + iVar34) * 8) +
                                               (long)((iVar35 * iVar40 + iVar37) * paVar1[iVar10].w2
                                                     * 8),paVar1[iVar10].w2,(short *)&local_88a8);
                                    iVar34 = iVar34 + 1;
                                    iVar39 = paVar1[iVar10].h;
                                    uVar26 = extraout_RDX_12;
                                  } while (iVar34 < iVar39);
                                }
                                iVar37 = iVar37 + 1;
                                bVar46 = iVar37 < paVar1[iVar10].v;
                              } while (iVar37 < paVar1[iVar10].v);
                            }
LAB_0014e597:
                            uVar27 = local_8948 + 1;
                          } while ((long)(local_8948 + 1) < (long)psVar14->scan_n);
                        }
                        uVar45 = (uint)uVar26;
                        iVar37 = psVar14->todo;
                        psVar14->todo = iVar37 + -1;
                        iVar10 = 1;
                        if (iVar37 < 2) {
                          if (psVar14->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar14);
                            uVar45 = extraout_EDX_02;
                          }
                          if ((psVar14->marker & 0xf8) != 0xd0) goto LAB_0014e6a2;
                          psVar14->code_buffer = 0;
                          psVar14->code_bits = 0;
                          psVar14->nomore = 0;
                          psVar14->img_comp[3].dc_pred = 0;
                          psVar14->img_comp[2].dc_pred = 0;
                          psVar14->img_comp[1].dc_pred = 0;
                          psVar14->img_comp[0].dc_pred = 0;
                          psVar14->marker = 0xff;
                          iVar10 = psVar14->restart_interval;
                          uVar26 = 0x7fffffff;
                          if (iVar10 == 0) {
                            iVar10 = 0x7fffffff;
                          }
                          psVar14->todo = iVar10;
                          psVar14->eob_run = 0;
                        }
                        local_8978 = local_8978 + 1;
                      } while (local_8978 < psVar14->img_mcu_x);
                    }
                    uVar45 = (uint)uVar26;
                    iVar10 = 1;
                    iVar40 = iVar40 + 1;
                  } while (iVar40 < psVar14->img_mcu_y);
                }
              }
            }
            else if (iVar40 == 1) {
              local_88c0 = (ulong)psVar14->order[0];
              iVar40 = psVar14->img_comp[local_88c0].y + 7 >> 3;
              iVar10 = 1;
              if (0 < iVar40) {
                paVar25 = paVar1 + local_88c0;
                iVar37 = psVar14->img_comp[local_88c0].x + 7 >> 3;
                local_893c = 0;
                local_88d8 = paVar25;
                do {
                  if (0 < iVar37) {
                    iVar10 = 0;
                    do {
                      piVar43 = local_88e0;
                      psVar31 = paVar25->coeff + (paVar25->coeff_w * local_893c + iVar10) * 0x40;
                      uVar27 = (ulong)psVar14->spec_start;
                      if (uVar27 == 0) {
                        iVar39 = stbi__jpeg_decode_block_prog_dc
                                           (psVar14,psVar31,
                                            (stbi__huffman *)psVar14->huff_dc[paVar25->hd].fast,
                                            (int)local_88c0);
                        uVar26 = extraout_RDX_03;
                        if (iVar39 != 0) goto LAB_0014dc81;
                        bVar46 = false;
                        local_8948 = 0;
                      }
                      else {
                        lVar15 = (long)paVar25->ha;
                        local_8978 = psVar14->succ_low;
                        iVar39 = psVar14->eob_run;
                        bVar8 = (byte)local_8978;
                        if (psVar14->succ_high == 0) {
                          if (iVar39 == 0) {
                            do {
                              if (psVar14->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar14);
                              }
                              sVar44 = psVar14->fast_ac[lVar15][psVar14->code_buffer >> 0x17];
                              uVar45 = (uint)sVar44;
                              iVar39 = (int)uVar27;
                              if (sVar44 == 0) {
                                if (psVar14->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar14);
                                }
                                uVar45 = psVar14->code_buffer;
                                uVar38 = (ulong)uVar45;
                                uVar26 = (ulong)psVar14->huff_ac[lVar15].fast[uVar45 >> 0x17];
                                if (uVar26 == 0xff) {
                                  lVar22 = 0;
                                  do {
                                    lVar32 = lVar22;
                                    lVar22 = lVar32 + 1;
                                  } while ((uint)piVar43[lVar15 * 0x1a4 + lVar32 + -0x11] <=
                                           uVar45 >> 0x10);
                                  iVar34 = psVar14->code_bits;
                                  if (lVar22 == 8) {
                                    psVar14->code_bits = iVar34 + -0x10;
                                    uVar36 = 0xffffffff;
                                  }
                                  else {
                                    uVar36 = 0xffffffff;
                                    if ((int)(lVar32 + 10) <= iVar34) {
                                      iVar35 = (uVar45 >> (0x17U - (char)lVar22 & 0x1f) &
                                               stbi__bmask[lVar32 + 10]) +
                                               piVar43[lVar15 * 0x1a4 + lVar22];
                                      bVar2 = psVar14->huff_ac[lVar15].size[iVar35];
                                      if ((uVar45 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                          (uint)psVar14->huff_ac[lVar15].code[iVar35])
                                      goto LAB_001506a3;
                                      uVar45 = uVar45 << ((byte)(lVar32 + 10) & 0x1f);
                                      uVar38 = (ulong)uVar45;
                                      psVar14->code_bits = (iVar34 - (int)lVar22) + -9;
                                      psVar14->code_buffer = uVar45;
                                      uVar36 = (ulong)psVar14->huff_ac[lVar15].values[iVar35];
                                    }
                                  }
                                }
                                else {
                                  bVar2 = psVar14->huff_ac[lVar15].size[uVar26];
                                  uVar36 = 0xffffffff;
                                  if ((int)(uint)bVar2 <= psVar14->code_bits) {
                                    uVar45 = uVar45 << (bVar2 & 0x1f);
                                    uVar38 = (ulong)uVar45;
                                    psVar14->code_buffer = uVar45;
                                    psVar14->code_bits = psVar14->code_bits - (uint)bVar2;
                                    uVar36 = (ulong)psVar14->huff_ac[lVar15].values[uVar26];
                                  }
                                }
                                uVar45 = (uint)uVar36;
                                if ((int)uVar45 < 0) {
                                  stbi__g_failure_reason = "bad huffman code";
                                  iVar39 = 1;
                                  uVar26 = 0;
                                }
                                else {
                                  uVar26 = uVar36 >> 4;
                                  uVar23 = uVar45 & 0xf;
                                  if ((uVar36 & 0xf) == 0) {
                                    if (uVar45 < 0xf0) {
                                      psVar14->eob_run = 1 << ((byte)uVar26 & 0x1f);
                                      if (0xf < uVar45) {
                                        if (psVar14->code_bits < (int)uVar26) {
                                          stbi__grow_buffer_unsafe(psVar14);
                                        }
                                        bVar2 = (byte)uVar26 & 0x1f;
                                        uVar23 = psVar14->code_buffer << bVar2 |
                                                 psVar14->code_buffer >> 0x20 - bVar2;
                                        uVar45 = stbi__bmask[uVar26];
                                        psVar14->code_buffer = ~uVar45 & uVar23;
                                        psVar14->code_bits = psVar14->code_bits - (int)uVar26;
                                        psVar14->eob_run = psVar14->eob_run + (uVar23 & uVar45);
                                      }
                                      psVar14->eob_run = psVar14->eob_run + -1;
                                      iVar39 = 2;
                                      uVar26 = 0;
                                      goto LAB_0014e075;
                                    }
                                    uVar45 = iVar39 + 0x10;
                                  }
                                  else {
                                    bVar2 = ""[(long)iVar39 + uVar26];
                                    if (psVar14->code_bits < (int)uVar23) {
                                      stbi__grow_buffer_unsafe(psVar14);
                                    }
                                    uVar45 = psVar14->code_buffer;
                                    uVar24 = uVar45 << (sbyte)uVar23 |
                                             uVar45 >> 0x20 - (sbyte)uVar23;
                                    uVar12 = *(uint *)((long)stbi__bmask + (ulong)(uVar23 * 4));
                                    psVar14->code_buffer = ~uVar12 & uVar24;
                                    psVar14->code_bits = psVar14->code_bits - uVar23;
                                    iVar34 = 0;
                                    if (-1 < (int)uVar45) {
                                      iVar34 = *(int *)((long)stbi__jbias + (ulong)(uVar23 * 4));
                                    }
                                    uVar23 = (uVar24 & uVar12) + iVar34 << (bVar8 & 0x1f);
                                    uVar38 = (ulong)uVar23;
                                    uVar45 = (int)((long)iVar39 + uVar26) + 1;
                                    psVar31[bVar2] = (short)uVar23;
                                  }
                                  iVar39 = 0;
                                  uVar27 = (ulong)uVar45;
                                  uVar26 = CONCAT71((int7)(uVar38 >> 8),1);
                                }
                              }
                              else {
                                psVar14->code_buffer = psVar14->code_buffer << (sbyte)(uVar45 & 0xf)
                                ;
                                psVar14->code_bits = psVar14->code_bits - (uVar45 & 0xf);
                                lVar22 = (long)iVar39 + (ulong)(uVar45 >> 4 & 0xf);
                                uVar27 = (ulong)((int)lVar22 + 1);
                                psVar31[""[lVar22]] = (short)((uVar45 >> 8) << (bVar8 & 0x1f));
                                iVar39 = 0 << (bVar8 & 0x1f);
                                uVar26 = 1;
                              }
LAB_0014e075:
                              bVar46 = false;
                              uVar38 = 1;
                              if (iVar39 != 0) {
                                if (iVar39 != 2) {
                                  uVar38 = uVar26;
                                }
                                break;
                              }
                            } while ((int)uVar27 <= psVar14->spec_end);
                          }
                          else {
                            psVar14->eob_run = iVar39 + -1;
                            bVar46 = true;
                            uVar38 = 0;
                          }
                          if ((char)uVar38 != '\0') goto LAB_0014dc57;
                        }
                        else {
                          if (iVar39 == 0) {
                            uVar45 = (0x10000 << (bVar8 & 0x1f)) >> 0x10;
                            do {
                              if (psVar14->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar14);
                              }
                              uVar23 = psVar14->code_buffer;
                              uVar26 = (ulong)uVar23;
                              uVar38 = (ulong)psVar14->huff_ac[lVar15].fast[uVar23 >> 0x17];
                              if (uVar38 == 0xff) {
                                lVar22 = 0;
                                do {
                                  lVar32 = lVar22;
                                  lVar22 = lVar32 + 1;
                                } while ((uint)piVar43[lVar15 * 0x1a4 + lVar32 + -0x11] <=
                                         uVar23 >> 0x10);
                                iVar39 = psVar14->code_bits;
                                if (lVar22 == 8) {
                                  psVar14->code_bits = iVar39 + -0x10;
                                  uVar36 = 0xffffffff;
                                }
                                else {
                                  uVar36 = 0xffffffff;
                                  if ((int)(lVar32 + 10) <= iVar39) {
                                    iVar34 = (uVar23 >> (0x17U - (char)lVar22 & 0x1f) &
                                             stbi__bmask[lVar32 + 10]) +
                                             piVar43[lVar15 * 0x1a4 + lVar22];
                                    bVar2 = psVar14->huff_ac[lVar15].size[iVar34];
                                    if ((uVar23 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                        (uint)psVar14->huff_ac[lVar15].code[iVar34]) {
LAB_001506a3:
                                      __assert_fail(
                                                  "(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/stb/stb_image.h"
                                                  ,0x75e,
                                                  "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                                  );
                                    }
                                    uVar23 = uVar23 << ((byte)(lVar32 + 10) & 0x1f);
                                    uVar26 = (ulong)uVar23;
                                    psVar14->code_bits = (iVar39 - (int)lVar22) + -9;
                                    psVar14->code_buffer = uVar23;
                                    uVar36 = (ulong)psVar14->huff_ac[lVar15].values[iVar34];
                                  }
                                }
                              }
                              else {
                                bVar2 = psVar14->huff_ac[lVar15].size[uVar38];
                                uVar36 = 0xffffffff;
                                if ((int)(uint)bVar2 <= psVar14->code_bits) {
                                  uVar23 = uVar23 << (bVar2 & 0x1f);
                                  uVar26 = (ulong)uVar23;
                                  psVar14->code_buffer = uVar23;
                                  psVar14->code_bits = psVar14->code_bits - (uint)bVar2;
                                  uVar36 = (ulong)psVar14->huff_ac[lVar15].values[uVar38];
                                }
                              }
                              uVar23 = (uint)uVar36;
                              if ((int)uVar23 < 0) {
                                stbi__g_failure_reason = "bad huffman code";
                                bVar46 = false;
                              }
                              else {
                                uVar38 = uVar36 >> 4;
                                if ((uVar23 & 0xf) == 1) {
                                  if (psVar14->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar14);
                                    uVar26 = extraout_RDX_04;
                                  }
                                  uVar23 = psVar14->code_buffer;
                                  psVar14->code_buffer = uVar23 * 2;
                                  psVar14->code_bits = psVar14->code_bits + -1;
                                  sVar44 = (short)(((int)~uVar23 >> 0x1f | 1U) << (bVar8 & 0x1f));
                                }
                                else {
                                  if ((uVar36 & 0xf) != 0) {
                                    stbi__g_failure_reason = "bad huffman code";
                                    bVar46 = false;
                                    goto LAB_0014dc42;
                                  }
                                  if (uVar23 < 0xf0) {
                                    psVar14->eob_run = ~(-1 << ((byte)uVar38 & 0x1f));
                                    if (0xf < uVar23) {
                                      if (psVar14->code_bits < (int)uVar38) {
                                        stbi__grow_buffer_unsafe(psVar14);
                                      }
                                      bVar2 = (byte)uVar38 & 0x1f;
                                      uVar12 = psVar14->code_buffer << bVar2 |
                                               psVar14->code_buffer >> 0x20 - bVar2;
                                      uVar23 = stbi__bmask[uVar38];
                                      uVar24 = ~uVar23 & uVar12;
                                      uVar26 = (ulong)uVar24;
                                      psVar14->code_buffer = uVar24;
                                      psVar14->code_bits = psVar14->code_bits - (int)uVar38;
                                      psVar14->eob_run = psVar14->eob_run + (uVar12 & uVar23);
                                    }
                                    sVar44 = 0;
                                    uVar38 = 0x40;
                                  }
                                  else {
                                    sVar44 = 0;
                                    uVar38 = 0xf;
                                  }
                                }
                                uVar27 = (ulong)(int)uVar27;
                                do {
                                  if ((long)psVar14->spec_end < (long)uVar27) break;
                                  bVar2 = ""[uVar27];
                                  if (psVar31[bVar2] == 0) {
                                    if ((int)uVar38 == 0) {
                                      psVar31[bVar2] = sVar44;
                                      bVar46 = false;
                                      uVar38 = 0;
                                    }
                                    else {
                                      uVar38 = (ulong)((int)uVar38 - 1);
                                      bVar46 = true;
                                    }
                                  }
                                  else {
                                    if (psVar14->code_bits < 1) {
                                      stbi__grow_buffer_unsafe(psVar14);
                                      uVar26 = extraout_RDX_05;
                                    }
                                    sVar11 = psVar14->code_buffer;
                                    psVar14->code_buffer = sVar11 * 2;
                                    psVar14->code_bits = psVar14->code_bits + -1;
                                    bVar46 = true;
                                    if (((int)sVar11 < 0) &&
                                       (sVar3 = psVar31[bVar2], (uVar45 & (int)sVar3) == 0)) {
                                      uVar23 = uVar45;
                                      if (sVar3 < 1) {
                                        uVar23 = -uVar45;
                                      }
                                      psVar31[bVar2] = sVar3 + (short)uVar23;
                                    }
                                  }
                                  uVar27 = uVar27 + 1;
                                } while (bVar46);
                                bVar46 = true;
                              }
LAB_0014dc42:
                              if (!bVar46) {
                                bVar46 = false;
                                goto LAB_0014dc5c;
                              }
                            } while ((int)uVar27 <= psVar14->spec_end);
                          }
                          else {
                            psVar14->eob_run = iVar39 + -1;
                            if (psVar14->spec_start <= psVar14->spec_end) {
                              uVar45 = (0x10000 << (bVar8 & 0x1f)) >> 0x10;
                              do {
                                bVar8 = ""[uVar27];
                                if (psVar31[bVar8] != 0) {
                                  if (psVar14->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar14);
                                    uVar26 = extraout_RDX_02;
                                  }
                                  sVar11 = psVar14->code_buffer;
                                  psVar14->code_buffer = sVar11 * 2;
                                  psVar14->code_bits = psVar14->code_bits + -1;
                                  if (((int)sVar11 < 0) &&
                                     (sVar44 = psVar31[bVar8], (uVar45 & (int)sVar44) == 0)) {
                                    uVar23 = -uVar45;
                                    if (0 < sVar44) {
                                      uVar23 = uVar45;
                                    }
                                    psVar31[bVar8] = (short)uVar23 + sVar44;
                                  }
                                }
                                bVar46 = (long)uVar27 < (long)psVar14->spec_end;
                                uVar27 = uVar27 + 1;
                              } while (bVar46);
                            }
                          }
LAB_0014dc57:
                          bVar46 = true;
                        }
LAB_0014dc5c:
                        if (!bVar46) {
                          local_8948._0_4_ = 0;
                        }
                        local_8948 = (ulong)(uint)local_8948;
                        paVar25 = local_88d8;
                        if (!bVar46) {
                          bVar46 = false;
                        }
                        else {
LAB_0014dc81:
                          iVar39 = psVar14->todo;
                          psVar14->todo = iVar39 + -1;
                          bVar46 = true;
                          if (iVar39 < 2) {
                            if (psVar14->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar14);
                              uVar26 = extraout_RDX_06;
                            }
                            if ((psVar14->marker & 0xf8) == 0xd0) {
                              psVar14->code_buffer = 0;
                              psVar14->code_bits = 0;
                              psVar14->nomore = 0;
                              psVar14->img_comp[3].dc_pred = 0;
                              psVar14->img_comp[2].dc_pred = 0;
                              psVar14->img_comp[1].dc_pred = 0;
                              psVar14->img_comp[0].dc_pred = 0;
                              psVar14->marker = 0xff;
                              iVar39 = psVar14->restart_interval;
                              uVar26 = 0x7fffffff;
                              if (iVar39 == 0) {
                                iVar39 = 0x7fffffff;
                              }
                              psVar14->todo = iVar39;
                              psVar14->eob_run = 0;
                            }
                            else {
                              local_8948 = 1;
                              bVar46 = false;
                            }
                          }
                        }
                      }
                      uVar45 = (uint)uVar26;
                      if (!bVar46) {
                        iVar10 = (int)local_8948;
                        goto LAB_0014e6a2;
                      }
                      iVar10 = iVar10 + 1;
                    } while (iVar10 != iVar37);
                  }
                  uVar45 = (uint)uVar26;
                  iVar10 = 1;
                  local_893c = local_893c + 1;
                } while (local_893c != iVar40);
              }
            }
            else {
              iVar10 = 1;
              if (0 < psVar14->img_mcu_y) {
                iVar10 = 0;
                do {
                  if (0 < psVar14->img_mcu_x) {
                    iVar40 = 0;
                    do {
                      if (0 < psVar14->scan_n) {
                        lVar15 = 0;
                        do {
                          iVar37 = psVar14->order[lVar15];
                          if (0 < psVar14->img_comp[iVar37].v) {
                            iVar39 = 0;
                            bVar46 = true;
                            do {
                              iVar34 = paVar1[iVar37].h;
                              if (0 < iVar34) {
                                iVar35 = 0;
                                do {
                                  iVar34 = stbi__jpeg_decode_block_prog_dc
                                                     (psVar14,paVar1[iVar37].coeff +
                                                              (iVar34 * iVar40 + iVar35 +
                                                              (paVar1[iVar37].v * iVar10 + iVar39) *
                                                              paVar1[iVar37].coeff_w) * 0x40,
                                                      (stbi__huffman *)
                                                      psVar14->huff_dc[paVar1[iVar37].hd].fast,
                                                      iVar37);
                                  uVar45 = (uint)extraout_RDX_10;
                                  uVar26 = extraout_RDX_10;
                                  if (iVar34 == 0) {
                                    if (bVar46) goto LAB_0014e68a;
                                    goto LAB_0014e366;
                                  }
                                  iVar35 = iVar35 + 1;
                                  iVar34 = paVar1[iVar37].h;
                                } while (iVar35 < iVar34);
                              }
                              iVar39 = iVar39 + 1;
                              bVar46 = iVar39 < paVar1[iVar37].v;
                            } while (iVar39 < paVar1[iVar37].v);
                          }
LAB_0014e366:
                          lVar15 = lVar15 + 1;
                        } while (lVar15 < psVar14->scan_n);
                      }
                      uVar45 = (uint)uVar26;
                      iVar37 = psVar14->todo;
                      psVar14->todo = iVar37 + -1;
                      if (iVar37 < 2) {
                        if (psVar14->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar14);
                          uVar45 = extraout_EDX_01;
                        }
                        if ((psVar14->marker & 0xf8) != 0xd0) goto LAB_0014e433;
                        psVar14->code_buffer = 0;
                        psVar14->code_bits = 0;
                        psVar14->nomore = 0;
                        psVar14->img_comp[3].dc_pred = 0;
                        psVar14->img_comp[2].dc_pred = 0;
                        psVar14->img_comp[1].dc_pred = 0;
                        psVar14->img_comp[0].dc_pred = 0;
                        psVar14->marker = 0xff;
                        iVar37 = psVar14->restart_interval;
                        uVar26 = 0x7fffffff;
                        if (iVar37 == 0) {
                          iVar37 = 0x7fffffff;
                        }
                        psVar14->todo = iVar37;
                        psVar14->eob_run = 0;
                      }
                      iVar40 = iVar40 + 1;
                    } while (iVar40 < psVar14->img_mcu_x);
                  }
                  uVar45 = (uint)uVar26;
                  iVar10 = iVar10 + 1;
                } while (iVar10 < psVar14->img_mcu_y);
                goto LAB_0014e433;
              }
            }
            goto LAB_0014e6a2;
          }
          stbi__g_failure_reason = "bad SOS component count";
LAB_0014f74d:
          uVar45 = (uint)paVar25;
        }
        else {
          if (bVar8 == 0xdc) {
            iVar10 = stbi__get16be(psVar14->s);
            sVar11 = stbi__get16be(psVar14->s);
            paVar25 = extraout_RDX;
            if (iVar10 == 4) {
              if (sVar11 == psVar14->s->img_y) goto LAB_0014e6b4;
              stbi__g_failure_reason = "bad DNL height";
            }
            else {
              stbi__g_failure_reason = "bad DNL len";
            }
            goto LAB_0014f74d;
          }
          if (bVar8 == 0xd9) {
            if ((psVar14->progressive != 0) && (0 < psVar14->s->img_n)) {
              lVar15 = 0;
              do {
                iVar10 = psVar14->img_comp[lVar15].y + 7 >> 3;
                if (0 < iVar10) {
                  uVar45 = paVar1[lVar15].x + 7 >> 3;
                  iVar40 = 0;
                  do {
                    if (0 < (int)uVar45) {
                      uVar26 = 0;
                      do {
                        psVar31 = paVar1[lVar15].coeff +
                                  (paVar1[lVar15].coeff_w * iVar40 + (int)uVar26) * 0x40;
                        iVar37 = paVar1[lVar15].tq;
                        lVar22 = 0;
                        do {
                          psVar31[lVar22] = psVar31[lVar22] * psVar14->dequant[iVar37][lVar22];
                          lVar22 = lVar22 + 1;
                        } while (lVar22 != 0x40);
                        (*psVar14->idct_block_kernel)
                                  (paVar1[lVar15].data +
                                   uVar26 * 8 + (long)(iVar40 * 8 * paVar1[lVar15].w2),
                                   paVar1[lVar15].w2,psVar31);
                        uVar26 = uVar26 + 1;
                      } while (uVar26 != uVar45);
                    }
                    iVar40 = iVar40 + 1;
                  } while (iVar40 != iVar10);
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 < psVar14->s->img_n);
            }
            if (req_comp == 0) {
              req_comp = (uint)(2 < psVar14->s->img_n) * 2 + 1;
            }
            uVar45 = psVar14->s->img_n;
            if (uVar45 == 3) {
              bVar46 = true;
              if (psVar14->rgb != 3) {
                if (psVar14->app14_color_transform != 0) goto LAB_0014eed7;
                bVar46 = psVar14->jfif == 0;
              }
            }
            else {
LAB_0014eed7:
              bVar46 = false;
            }
            uVar23 = 1;
            if (bVar46) {
              uVar23 = uVar45;
            }
            if (2 < req_comp) {
              uVar23 = uVar45;
            }
            if (uVar45 != 3) {
              uVar23 = uVar45;
            }
            if ((int)uVar23 < 1) {
LAB_0014f044:
              psVar16 = psVar14->s;
              sVar11 = psVar16->img_y;
              psVar19 = (stbi__context *)stbi__malloc_mad3(req_comp,psVar16->img_x,sVar11,1);
              iVar10 = (int)extraout_RDX_13;
              if (psVar19 != (stbi__context *)0x0) {
                if (sVar11 != 0) {
                  iVar40 = 0;
                  uVar45 = 0;
                  uVar26 = extraout_RDX_13;
                  do {
                    sVar11 = psVar16->img_x;
                    if (0 < (int)uVar23) {
                      pasVar42 = (stbi_uc (*) [4])&local_88a8.ratio;
                      uVar27 = 0;
                      piVar43 = &psVar14->img_comp[0].y;
                      do {
                        asVar4 = pasVar42[-1];
                        asVar5 = pasVar42[-3];
                        iVar10 = (int)asVar5 >> 1;
                        auVar47 = (**(code **)(pasVar42 + -10))
                                            (*(stbi_uc **)(piVar43 + 10),
                                             *(undefined8 *)
                                              (*pasVar42 +
                                              ((ulong)(iVar10 <= (int)asVar4) << 3 |
                                              0xffffffffffffffe0)),
                                             *(undefined8 *)
                                              (*pasVar42 +
                                              ((ulong)((int)asVar4 < iVar10) << 3 |
                                              0xffffffffffffffe0)),pasVar42[-2]);
                        uVar26 = auVar47._8_8_;
                        *(long *)(&local_8908.bpp + uVar27 * 2) = auVar47._0_8_;
                        pasVar42[-1] = (stbi_uc  [4])((int)asVar4 + 1);
                        if ((int)asVar5 <= (int)asVar4 + 1) {
                          pasVar42[-1] = (stbi_uc  [4])0x0;
                          *(stbi_uc **)(pasVar42 + -8) = *(stbi_uc **)(pasVar42 + -6);
                          asVar4 = *pasVar42;
                          *pasVar42 = (stbi_uc  [4])((int)asVar4 + 1);
                          if ((int)asVar4 + 1 < *piVar43) {
                            *(stbi_uc **)(pasVar42 + -6) = *(stbi_uc **)(pasVar42 + -6) + piVar43[1]
                            ;
                          }
                        }
                        uVar27 = uVar27 + 1;
                        piVar43 = piVar43 + 0x18;
                        pasVar42 = pasVar42 + 0xc;
                      } while (uVar23 != uVar27);
                    }
                    if (req_comp < 3) {
                      psVar16 = psVar14->s;
                      if (bVar46) {
                        if (req_comp == 1) {
                          if (psVar16->img_x != 0) {
                            uVar26 = CONCAT44(local_8908.mr,local_8908.hsz);
                            uVar27 = 0;
                            do {
                              bVar8 = *(byte *)(CONCAT44(local_8908.mb,local_8908.mg) + uVar27);
                              psVar19->buffer_start[uVar27 + sVar11 * iVar40 + -0x38] =
                                   (stbi_uc)((uint)bVar8 * 2 + ((uint)bVar8 + (uint)bVar8 * 8) * 3 +
                                             (uint)*(byte *)(uVar26 + uVar27) * 0x96 +
                                             (uint)*(byte *)(CONCAT44(local_8908.offset,
                                                                      local_8908.bpp) + uVar27) *
                                             0x4d >> 8);
                              uVar27 = uVar27 + 1;
                            } while (uVar27 < psVar16->img_x);
                          }
                        }
                        else if (psVar16->img_x != 0) {
                          uVar26 = CONCAT44(local_8908.mr,local_8908.hsz);
                          uVar27 = 0;
                          do {
                            bVar8 = *(byte *)(CONCAT44(local_8908.mb,local_8908.mg) + uVar27);
                            psVar19->buffer_start[uVar27 * 2 + (ulong)(sVar11 * iVar40) + -0x38] =
                                 (stbi_uc)((uint)bVar8 * 2 + ((uint)bVar8 + (uint)bVar8 * 8) * 3 +
                                           (uint)*(byte *)(uVar26 + uVar27) * 0x96 +
                                           (uint)*(byte *)(CONCAT44(local_8908.offset,local_8908.bpp
                                                                   ) + uVar27) * 0x4d >> 8);
                            psVar19->buffer_start[uVar27 * 2 + (ulong)(sVar11 * iVar40) + -0x37] =
                                 0xff;
                            uVar27 = uVar27 + 1;
                          } while (uVar27 < psVar16->img_x);
                        }
                      }
                      else if (psVar16->img_n == 4) {
                        if (psVar14->app14_color_transform == 2) {
                          if (psVar16->img_x != 0) {
                            uVar26 = CONCAT44(local_8908.all_a,local_8908.ma);
                            psVar30 = psVar19->buffer_start + ((ulong)(sVar11 * iVar40) - 0x37);
                            uVar27 = 0;
                            do {
                              iVar10 = (*(byte *)(CONCAT44(local_8908.offset,local_8908.bpp) +
                                                 uVar27) ^ 0xff) * (uint)*(byte *)(uVar26 + uVar27);
                              psVar30[-1] = (char)((iVar10 + 0x80U >> 8) + iVar10 + 0x80 >> 8);
                              *psVar30 = 0xff;
                              uVar27 = uVar27 + 1;
                              psVar30 = psVar30 + (uint)req_comp;
                            } while (uVar27 < psVar16->img_x);
                          }
                        }
                        else {
                          if (psVar14->app14_color_transform != 0) goto LAB_0014f486;
                          if (psVar16->img_x != 0) {
                            uVar26 = CONCAT44(local_8908.offset,local_8908.bpp);
                            psVar30 = psVar19->buffer_start + ((ulong)(sVar11 * iVar40) - 0x37);
                            uVar27 = 0;
                            do {
                              bVar8 = *(byte *)(CONCAT44(local_8908.all_a,local_8908.ma) + uVar27);
                              iVar37 = (uint)*(byte *)(uVar26 + uVar27) * (uint)bVar8;
                              iVar39 = (uint)*(byte *)(CONCAT44(local_8908.mr,local_8908.hsz) +
                                                      uVar27) * (uint)bVar8;
                              iVar10 = (uint)*(byte *)(CONCAT44(local_8908.mb,local_8908.mg) +
                                                      uVar27) * (uint)bVar8;
                              psVar30[-1] = (char)((iVar10 + (iVar10 + 0x80U >> 8) + 0x80 >> 8 &
                                                   0xff) * 0x1d +
                                                   (iVar39 + (iVar39 + 0x80U >> 8) + 0x80 >> 8 &
                                                   0xff) * 0x96 +
                                                   (iVar37 + (iVar37 + 0x80U >> 8) + 0x80 >> 8 &
                                                   0xff) * 0x4d >> 8);
                              *psVar30 = 0xff;
                              uVar27 = uVar27 + 1;
                              psVar30 = psVar30 + (uint)req_comp;
                            } while (uVar27 < psVar16->img_x);
                          }
                        }
                      }
                      else {
LAB_0014f486:
                        uVar12 = psVar16->img_x;
                        uVar26 = (ulong)uVar12;
                        if (req_comp == 1) {
                          if (uVar12 != 0) {
                            uVar26 = 0;
                            do {
                              psVar19->buffer_start[uVar26 + sVar11 * iVar40 + -0x38] =
                                   *(stbi_uc *)(CONCAT44(local_8908.offset,local_8908.bpp) + uVar26)
                              ;
                              uVar26 = uVar26 + 1;
                            } while (uVar26 < psVar16->img_x);
                          }
                        }
                        else if (uVar12 != 0) {
                          uVar26 = 0;
                          do {
                            psVar19->buffer_start[uVar26 * 2 + (ulong)(sVar11 * iVar40) + -0x38] =
                                 *(stbi_uc *)(CONCAT44(local_8908.offset,local_8908.bpp) + uVar26);
                            psVar19->buffer_start[uVar26 * 2 + (ulong)(sVar11 * iVar40) + -0x37] =
                                 0xff;
                            uVar26 = uVar26 + 1;
                          } while (uVar26 < psVar16->img_x);
                        }
                      }
                    }
                    else {
                      psVar30 = (stbi_uc *)CONCAT44(local_8908.offset,local_8908.bpp);
                      psVar16 = psVar14->s;
                      if (psVar16->img_n == 3) {
                        if (bVar46) {
                          if (psVar16->img_x != 0) {
                            uVar26 = CONCAT44(local_8908.mb,local_8908.mg);
                            psVar29 = psVar19->buffer_start + ((ulong)(sVar11 * iVar40) - 0x35);
                            uVar27 = 0;
                            do {
                              psVar29[-3] = psVar30[uVar27];
                              psVar29[-2] = *(undefined1 *)
                                             (CONCAT44(local_8908.mr,local_8908.hsz) + uVar27);
                              psVar29[-1] = *(undefined1 *)(uVar26 + uVar27);
                              *psVar29 = 0xff;
                              uVar27 = uVar27 + 1;
                              psVar29 = psVar29 + (uint)req_comp;
                            } while (uVar27 < psVar16->img_x);
                          }
                        }
                        else {
LAB_0014f4fb:
                          (*psVar14->YCbCr_to_RGB_kernel)
                                    (psVar19->buffer_start +
                                     ((ulong)(uVar45 * req_comp * sVar11) - 0x38),psVar30,
                                     (stbi_uc *)CONCAT44(local_8908.mr,local_8908.hsz),
                                     (stbi_uc *)CONCAT44(local_8908.mb,local_8908.mg),psVar16->img_x
                                     ,req_comp);
                          uVar26 = extraout_RDX_14;
                        }
                      }
                      else if (psVar16->img_n == 4) {
                        if (psVar14->app14_color_transform == 2) {
                          (*psVar14->YCbCr_to_RGB_kernel)
                                    (psVar19->buffer_start +
                                     ((ulong)(uVar45 * req_comp * sVar11) - 0x38),psVar30,
                                     (stbi_uc *)CONCAT44(local_8908.mr,local_8908.hsz),
                                     (stbi_uc *)CONCAT44(local_8908.mb,local_8908.mg),psVar16->img_x
                                     ,req_comp);
                          psVar16 = psVar14->s;
                          uVar26 = extraout_RDX_15;
                          if (psVar16->img_x != 0) {
                            psVar30 = psVar19->buffer_start + ((ulong)(sVar11 * iVar40) - 0x36);
                            uVar26 = 0;
                            do {
                              bVar8 = *(byte *)(CONCAT44(local_8908.all_a,local_8908.ma) + uVar26);
                              iVar10 = (psVar30[-2] ^ 0xff) * (uint)bVar8;
                              psVar30[-2] = (byte)((iVar10 + 0x80U >> 8) + iVar10 + 0x80 >> 8);
                              iVar10 = (psVar30[-1] ^ 0xff) * (uint)bVar8;
                              psVar30[-1] = (byte)((iVar10 + 0x80U >> 8) + iVar10 + 0x80 >> 8);
                              iVar10 = (*psVar30 ^ 0xff) * (uint)bVar8;
                              *psVar30 = (byte)((iVar10 + 0x80U >> 8) + iVar10 + 0x80 >> 8);
                              uVar26 = uVar26 + 1;
                              psVar30 = psVar30 + (uint)req_comp;
                            } while (uVar26 < psVar16->img_x);
                          }
                        }
                        else {
                          if (psVar14->app14_color_transform != 0) goto LAB_0014f4fb;
                          if (psVar16->img_x != 0) {
                            uVar26 = CONCAT44(local_8908.mr,local_8908.hsz);
                            psVar29 = psVar19->buffer_start + ((ulong)(sVar11 * iVar40) - 0x35);
                            uVar27 = 0;
                            do {
                              bVar8 = *(byte *)(CONCAT44(local_8908.all_a,local_8908.ma) + uVar27);
                              iVar10 = (uint)psVar30[uVar27] * (uint)bVar8;
                              psVar29[-3] = (char)((iVar10 + 0x80U >> 8) + iVar10 + 0x80 >> 8);
                              iVar10 = (uint)*(byte *)(uVar26 + uVar27) * (uint)bVar8;
                              psVar29[-2] = (char)((iVar10 + 0x80U >> 8) + iVar10 + 0x80 >> 8);
                              iVar10 = (uint)*(byte *)(CONCAT44(local_8908.mb,local_8908.mg) +
                                                      uVar27) * (uint)bVar8;
                              psVar29[-1] = (char)((iVar10 + 0x80U >> 8) + iVar10 + 0x80 >> 8);
                              *psVar29 = 0xff;
                              uVar27 = uVar27 + 1;
                              psVar29 = psVar29 + (uint)req_comp;
                            } while (uVar27 < psVar16->img_x);
                          }
                        }
                      }
                      else if (psVar16->img_x != 0) {
                        psVar29 = psVar19->buffer_start + ((ulong)(sVar11 * iVar40) - 0x35);
                        uVar27 = 0;
                        do {
                          sVar7 = psVar30[uVar27];
                          psVar29[-1] = sVar7;
                          psVar29[-2] = sVar7;
                          psVar29[-3] = sVar7;
                          *psVar29 = 0xff;
                          uVar27 = uVar27 + 1;
                          uVar26 = (ulong)psVar16->img_x;
                          psVar29 = psVar29 + (uint)req_comp;
                        } while (uVar27 < uVar26);
                      }
                    }
                    iVar10 = (int)uVar26;
                    uVar45 = uVar45 + 1;
                    psVar16 = psVar14->s;
                    iVar40 = iVar40 + req_comp;
                  } while (uVar45 < psVar16->img_y);
                }
                stbi__free_jpeg_components(psVar14,psVar16->img_n,iVar10);
                psVar16 = psVar14->s;
                *x = psVar16->img_x;
                *y = psVar16->img_y;
                if (local_88e8 != (int *)0x0) {
                  *local_88e8 = (uint)(2 < psVar16->img_n) * 2 + 1;
                }
                goto LAB_0014f769;
              }
              stbi__free_jpeg_components(psVar14,psVar16->img_n,iVar10);
              stbi__g_failure_reason = "outofmem";
              goto LAB_0014f763;
            }
            lVar15 = 0;
            while( true ) {
              psVar16 = psVar14->s;
              sVar11 = psVar16->img_x;
              pvVar17 = malloc((ulong)(sVar11 + 3));
              *(void **)((long)&psVar14->img_comp[0].linebuf + lVar15 * 2) = pvVar17;
              if (pvVar17 == (void *)0x0) {
                stbi__free_jpeg_components(psVar14,psVar16->img_n,why);
                stbi__g_failure_reason = "outofmem";
              }
              else {
                uVar26 = (long)psVar14->img_h_max /
                         (long)*(int *)((long)&psVar14->img_comp[0].h + lVar15 * 2);
                iVar10 = (int)uVar26;
                *(int *)((long)(local_88a8.pal + -7) + lVar15) = iVar10;
                iVar40 = psVar14->img_v_max / *(int *)((long)&psVar14->img_comp[0].v + lVar15 * 2);
                *(int *)((long)(local_88a8.pal + -6) + lVar15) = iVar40;
                *(int *)((long)(local_88a8.pal + -4) + lVar15) = iVar40 >> 1;
                *(int *)((long)(local_88a8.pal + -5) + lVar15) =
                     (int)((ulong)((sVar11 + iVar10) - 1) / (uVar26 & 0xffffffff));
                *(undefined4 *)((long)(local_88a8.pal + -3) + lVar15) = 0;
                uVar6 = *(undefined8 *)((long)&psVar14->img_comp[0].data + lVar15 * 2);
                *(undefined8 *)((long)(local_88a8.pal + -9) + lVar15) = uVar6;
                *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar15) = uVar6;
                if ((iVar10 == 1) && (iVar40 == 1)) {
                  *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar15) =
                       resample_row_1;
                }
                else {
                  if ((iVar10 == 1) && (iVar40 == 2)) {
                    pcVar18 = stbi__resample_row_v_2;
                  }
                  else if ((iVar10 == 2) && (iVar40 == 1)) {
                    pcVar18 = stbi__resample_row_h_2;
                  }
                  else if ((iVar10 == 2) && (iVar40 == 2)) {
                    pcVar18 = psVar14->resample_row_hv_2_kernel;
                  }
                  else {
                    pcVar18 = stbi__resample_row_generic;
                  }
                  *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar15) = pcVar18;
                }
              }
              psVar19 = (stbi__context *)0x0;
              if (pvVar17 == (void *)0x0) break;
              lVar15 = lVar15 + 0x30;
              if ((ulong)uVar23 * 0x30 == lVar15) goto LAB_0014f044;
            }
            goto LAB_0014f769;
          }
          iVar10 = stbi__process_marker(psVar14,(uint)bVar8);
          uVar45 = extraout_EDX_00;
          if (iVar10 != 0) goto LAB_0014e6b4;
        }
      }
LAB_0014f754:
      stbi__free_jpeg_components(psVar14,psVar14->s->img_n,uVar45);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_0014f763:
    psVar19 = (stbi__context *)0x0;
LAB_0014f769:
    free(psVar14);
  }
  else {
    iVar10 = stbi__check_png_header(s);
    psVar29 = s->img_buffer_original;
    s->img_buffer = psVar29;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar10 != 0) {
      if ((uint)req_comp < 5) {
        local_88a8._0_8_ = s;
        iVar10 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
        data_00 = (stbi__uint16 *)local_88a8.history;
        uVar6 = local_88a8._0_8_;
        psVar41 = (stbi__uint16 *)0x0;
        if (iVar10 == 0) goto LAB_0014e9ac;
        iVar10 = 8;
        if (8 < local_88a8.flags) {
          iVar10 = local_88a8.flags;
        }
        ri->bits_per_channel = iVar10;
        local_88a8.history = (stbi_uc *)0x0;
        if ((req_comp != 0) && (iVar10 = *(int *)(local_88a8._0_8_ + 0xc), iVar10 != req_comp)) {
          if (local_88a8.flags < 9) {
            data_00 = (stbi__uint16 *)
                      stbi__convert_format
                                ((uchar *)data_00,iVar10,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          else {
            data_00 = stbi__convert_format16
                                (data_00,iVar10,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          *(int *)(uVar6 + 0xc) = req_comp;
          if (data_00 == (stbi__uint16 *)0x0) goto LAB_0014d16a;
        }
        *x = *(stbi__uint32 *)local_88a8._0_8_;
        *y = *(stbi__uint32 *)(local_88a8._0_8_ + 4);
        psVar41 = data_00;
        if (local_88e8 != (int *)0x0) {
          *local_88e8 = *(int *)(local_88a8._0_8_ + 8);
        }
LAB_0014e9ac:
        free(local_88a8.history);
        local_88a8.history = (stbi_uc *)0x0;
        free(local_88a8.background);
        local_88a8.background = (stbi_uc *)0x0;
        free(local_88a8.out);
        return psVar41;
      }
      stbi__g_failure_reason = "bad req_comp";
      goto LAB_0014d16a;
    }
    if (psVar29 < s->img_buffer_original_end) {
LAB_0014e8ff:
      s->img_buffer = psVar29 + 1;
      if (*psVar29 != 'B') goto LAB_0014eb39;
      psVar29 = s->img_buffer;
      if (s->img_buffer_end <= psVar29) {
        if (s->read_from_callbacks == 0) goto LAB_0014eb39;
        psVar29 = s->buffer_start;
        iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar29,s->buflen);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar29;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar29;
          s->img_buffer_end = psVar29 + iVar10;
        }
        psVar29 = s->img_buffer;
      }
      s->img_buffer = psVar29 + 1;
      if (*psVar29 != 'M') goto LAB_0014eb39;
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      uVar45 = stbi__get16le(s);
      iVar10 = stbi__get16le(s);
      uVar45 = iVar10 << 0x10 | uVar45;
      if ((((0x38 < uVar45) || ((0x100010000001000U >> ((ulong)uVar45 & 0x3f) & 1) == 0)) &&
          (uVar45 != 0x7c)) && (uVar45 != 0x6c)) goto LAB_0014eb39;
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      local_8908.all_a = 0xff;
      pvVar17 = stbi__bmp_parse_header(s,&local_8908);
      if (pvVar17 == (void *)0x0) goto LAB_0014d16a;
      local_88b4 = s->img_y;
      sVar11 = -local_88b4;
      if (0 < (int)local_88b4) {
        sVar11 = local_88b4;
      }
      s->img_y = sVar11;
      if (local_8908.hsz == 0xc) {
        if (local_8908.bpp < 0x18) {
          uVar26 = (ulong)(uint)((local_8908.offset + -0x26) / 3);
        }
        else {
LAB_0014ece3:
          uVar26 = 0;
        }
      }
      else {
        if (0xf < local_8908.bpp) goto LAB_0014ece3;
        uVar26 = (ulong)(uint)((local_8908.offset - local_8908.hsz) + -0xe >> 2);
      }
      local_8930 = local_8908.all_a;
      iVar10 = 4 - (uint)(local_8908.ma == 0);
      s->img_n = iVar10;
      if (2 < req_comp) {
        iVar10 = req_comp;
      }
      b = s->img_x;
      iVar40 = stbi__mad3sizes_valid(iVar10,b,sVar11,0);
      if (iVar40 == 0) {
        stbi__g_failure_reason = "too large";
      }
      else {
        data_01 = (uchar *)stbi__malloc_mad3(iVar10,b,sVar11,0);
        if (data_01 == (uchar *)0x0) {
          stbi__g_failure_reason = "outofmem";
        }
        else {
          if (local_8908.bpp < 0x10) {
            iVar40 = (int)uVar26;
            if (0x100 < iVar40 || iVar40 == 0) {
              free(data_01);
              stbi__g_failure_reason = "invalid";
              goto LAB_0014d16a;
            }
            if (0 < iVar40) {
              psVar30 = s->buffer_start;
              psVar29 = s->buffer_start + 1;
              uVar27 = 0;
              do {
                psVar20 = s->img_buffer;
                if (psVar20 < s->img_buffer_end) {
LAB_0014f8d9:
                  s->img_buffer = psVar20 + 1;
                  sVar7 = *psVar20;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar37 = (*(s->io).read)(s->io_user_data,(char *)psVar30,s->buflen);
                    if (iVar37 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar30;
                      s->img_buffer_end = psVar29;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar30;
                      s->img_buffer_end = psVar30 + iVar37;
                    }
                    psVar20 = s->img_buffer;
                    goto LAB_0014f8d9;
                  }
                  sVar7 = '\0';
                }
                local_88a8.pal[uVar27 - 0xd][2] = sVar7;
                psVar20 = s->img_buffer;
                if (psVar20 < s->img_buffer_end) {
LAB_0014f958:
                  s->img_buffer = psVar20 + 1;
                  sVar7 = *psVar20;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar37 = (*(s->io).read)(s->io_user_data,(char *)psVar30,s->buflen);
                    if (iVar37 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar30;
                      s->img_buffer_end = psVar29;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar30;
                      s->img_buffer_end = psVar30 + iVar37;
                    }
                    psVar20 = s->img_buffer;
                    goto LAB_0014f958;
                  }
                  sVar7 = '\0';
                }
                local_88a8.pal[uVar27 - 0xd][1] = sVar7;
                psVar20 = s->img_buffer;
                if (psVar20 < s->img_buffer_end) {
LAB_0014f9d7:
                  s->img_buffer = psVar20 + 1;
                  sVar7 = *psVar20;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar37 = (*(s->io).read)(s->io_user_data,(char *)psVar30,s->buflen);
                    if (iVar37 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar30;
                      s->img_buffer_end = psVar29;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar30;
                      s->img_buffer_end = psVar30 + iVar37;
                    }
                    psVar20 = s->img_buffer;
                    goto LAB_0014f9d7;
                  }
                  sVar7 = '\0';
                }
                local_88a8.pal[uVar27 - 0xd][0] = sVar7;
                if (local_8908.hsz != 0xc) {
                  psVar20 = s->img_buffer;
                  if (s->img_buffer_end <= psVar20) {
                    if (s->read_from_callbacks == 0) goto LAB_0014fa63;
                    iVar37 = (*(s->io).read)(s->io_user_data,(char *)psVar30,s->buflen);
                    if (iVar37 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar30;
                      s->img_buffer_end = psVar29;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar30;
                      s->img_buffer_end = psVar30 + iVar37;
                    }
                    psVar20 = s->img_buffer;
                  }
                  s->img_buffer = psVar20 + 1;
                }
LAB_0014fa63:
                local_88a8.pal[uVar27 - 0xd][3] = 0xff;
                uVar27 = uVar27 + 1;
              } while (uVar26 != uVar27);
            }
            stbi__skip(s,(iVar40 * (local_8908.hsz == 0xc | 0xfffffffc) - local_8908.hsz) +
                         local_8908.offset + -0xe);
            if (local_8908.bpp == 8) {
              uVar45 = s->img_x;
            }
            else if (local_8908.bpp == 4) {
              uVar45 = s->img_x + 1 >> 1;
            }
            else {
              if (local_8908.bpp != 1) {
                free(data_01);
                stbi__g_failure_reason = "bad bpp";
                goto LAB_0014d16a;
              }
              uVar45 = s->img_x + 7 >> 3;
            }
            if (local_8908.bpp == 1) {
              if (0 < (int)s->img_y) {
                local_8960 = -uVar45 & 3;
                psVar30 = s->buffer_start;
                iVar37 = 0;
                iVar40 = 0;
                do {
                  pbVar21 = s->img_buffer;
                  if (pbVar21 < s->img_buffer_end) {
LAB_00150337:
                    s->img_buffer = pbVar21 + 1;
                    uVar45 = (uint)*pbVar21;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar39 = (*(s->io).read)(s->io_user_data,(char *)psVar30,s->buflen);
                      if (iVar39 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar30;
                        s->img_buffer_end = s->buffer_start + 1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar30;
                        s->img_buffer_end = psVar30 + iVar39;
                      }
                      pbVar21 = s->img_buffer;
                      goto LAB_00150337;
                    }
                    uVar45 = 0;
                  }
                  if (0 < (int)s->img_x) {
                    puVar28 = data_01 + (long)iVar37 + 2;
                    iVar39 = 0;
                    uVar23 = 7;
                    do {
                      uVar26 = (ulong)((uVar45 >> (uVar23 & 0x1f) & 1) != 0);
                      puVar28[-2] = local_88a8.pal[uVar26 - 0xd][0];
                      puVar28[-1] = local_88a8.pal[uVar26 - 0xd][1];
                      *puVar28 = local_88a8.pal[uVar26 - 0xd][2];
                      if ((int)uVar23 < 1) {
                        pbVar21 = s->img_buffer;
                        if (pbVar21 < s->img_buffer_end) {
LAB_001503fa:
                          s->img_buffer = pbVar21 + 1;
                          uVar45 = (uint)*pbVar21;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar34 = (*(s->io).read)(s->io_user_data,(char *)psVar30,s->buflen);
                            if (iVar34 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar30;
                              s->img_buffer_end = s->buffer_start + 1;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar30;
                              s->img_buffer_end = psVar30 + iVar34;
                            }
                            pbVar21 = s->img_buffer;
                            goto LAB_001503fa;
                          }
                          uVar45 = 0;
                        }
                        uVar23 = 7;
                      }
                      else {
                        uVar23 = uVar23 - 1;
                      }
                      iVar39 = iVar39 + 1;
                      iVar37 = iVar37 + 3;
                      puVar28 = puVar28 + 3;
                    } while (iVar39 < (int)s->img_x);
                  }
                  stbi__skip(s,local_8960);
                  iVar40 = iVar40 + 1;
                } while (iVar40 < (int)s->img_y);
              }
            }
            else if (0 < (int)s->img_y) {
              psVar30 = s->buffer_start;
              uVar26 = 0;
              iVar40 = 0;
              local_8960 = -uVar45 & 3;
              do {
                if (0 < (int)s->img_x) {
                  iVar37 = 0;
                  do {
                    iVar39 = (int)uVar26;
                    pbVar21 = s->img_buffer;
                    if (pbVar21 < s->img_buffer_end) {
LAB_001504fe:
                      s->img_buffer = pbVar21 + 1;
                      uVar45 = (uint)*pbVar21;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar34 = (*(s->io).read)(s->io_user_data,(char *)psVar30,s->buflen);
                        if (iVar34 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar30;
                          s->img_buffer_end = s->buffer_start + 1;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar30;
                          s->img_buffer_end = psVar30 + iVar34;
                        }
                        pbVar21 = s->img_buffer;
                        goto LAB_001504fe;
                      }
                      uVar45 = 0;
                    }
                    uVar23 = uVar45 >> 4;
                    if (local_8908.bpp != 4) {
                      uVar23 = uVar45;
                    }
                    uVar26 = (ulong)uVar23;
                    uVar45 = uVar45 & 0xf;
                    if (local_8908.bpp != 4) {
                      uVar45 = 0;
                    }
                    uVar23 = iVar39 + 3;
                    data_01[iVar39] = local_88a8.pal[uVar26 - 0xd][0];
                    data_01[(long)iVar39 + 1] = local_88a8.pal[uVar26 - 0xd][1];
                    data_01[(long)iVar39 + 2] = local_88a8.pal[uVar26 - 0xd][2];
                    if (iVar10 == 4) {
                      uVar23 = iVar39 + 4;
                      data_01[(long)iVar39 + 3] = 0xff;
                    }
                    sVar11 = s->img_x;
                    if (iVar37 + 1U == sVar11) {
LAB_00150641:
                      uVar26 = (ulong)uVar23;
                    }
                    else {
                      if (local_8908.bpp == 8) {
                        pbVar21 = s->img_buffer;
                        if (s->img_buffer_end <= pbVar21) {
                          if (s->read_from_callbacks == 0) {
                            uVar45 = 0;
                            goto LAB_001505fd;
                          }
                          iVar39 = (*(s->io).read)(s->io_user_data,(char *)psVar30,s->buflen);
                          if (iVar39 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar30;
                            s->img_buffer_end = s->buffer_start + 1;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar30;
                            s->img_buffer_end = psVar30 + iVar39;
                          }
                          pbVar21 = s->img_buffer;
                        }
                        s->img_buffer = pbVar21 + 1;
                        uVar45 = (uint)*pbVar21;
                      }
LAB_001505fd:
                      lVar15 = (long)(int)uVar23;
                      uVar26 = lVar15 + 3;
                      uVar27 = (ulong)uVar45;
                      data_01[lVar15] = local_88a8.pal[uVar27 - 0xd][0];
                      data_01[lVar15 + 1] = local_88a8.pal[uVar27 - 0xd][1];
                      data_01[lVar15 + 2] = local_88a8.pal[uVar27 - 0xd][2];
                      if (iVar10 == 4) {
                        uVar23 = uVar23 + 4;
                        data_01[lVar15 + 3] = 0xff;
                        goto LAB_00150641;
                      }
                    }
                  } while ((iVar37 + 1U != sVar11) && (iVar37 = iVar37 + 2, iVar37 < (int)s->img_x))
                  ;
                }
                stbi__skip(s,local_8960);
                iVar40 = iVar40 + 1;
              } while (iVar40 < (int)s->img_y);
            }
          }
          else {
            psVar16 = s;
            stbi__skip(s,(local_8908.offset - local_8908.hsz) + -0xe);
            if (local_8908.bpp == 0x18) {
              iVar40 = -3;
LAB_0014fb25:
              local_88b0 = iVar40 * s->img_x & 3;
            }
            else {
              local_88b0 = 0;
              if (local_8908.bpp == 0x10) {
                iVar40 = -2;
                goto LAB_0014fb25;
              }
            }
            iVar40 = 0;
            if (local_8908.bpp == 0x18) {
              uVar26 = 0;
LAB_0014fb7e:
              local_88d8 = (anon_struct_96_18_0d0905d3 *)((ulong)local_88d8._4_4_ << 0x20);
            }
            else {
              uVar33 = (undefined7)((ulong)psVar16 >> 8);
              if (local_8908.bpp != 0x20) {
                uVar26 = CONCAT71(uVar33,1);
                goto LAB_0014fb7e;
              }
              uVar45 = local_8908.mr ^ 0xff0000 | local_8908.mg ^ 0xff00 | local_8908.mb ^ 0xff;
              local_88d8 = (anon_struct_96_18_0d0905d3 *)
                           CONCAT44(local_88d8._4_4_,
                                    CONCAT31((int3)(uVar45 >> 8),
                                             local_8908.ma == 0xff000000 && uVar45 == 0));
              uVar26 = CONCAT71(uVar33,local_8908.ma != 0xff000000 || uVar45 != 0);
            }
            iVar37 = 0;
            local_893c = 0;
            local_88c0 = local_88c0 & 0xffffffff00000000;
            uVar45 = 0;
            uVar23 = 0;
            local_8924 = 0;
            local_890c = 0;
            local_88cc = (uint)uVar26;
            if ((char)uVar26 == '\0') {
LAB_0014fd81:
              bVar46 = true;
              if (0 < (int)s->img_y) {
                local_88e0 = (int *)CONCAT44(local_88e0._4_4_,local_8908.mr);
                psVar30 = s->buffer_start;
                local_88c8 = s->buffer_start + 1;
                iVar34 = 0;
                iVar39 = 0;
                do {
                  local_88ac = iVar39;
                  if ((char)uVar26 == '\0') {
                    if (0 < (int)s->img_x) {
                      iVar39 = 0;
                      do {
                        puVar28 = s->img_buffer;
                        if (puVar28 < s->img_buffer_end) {
LAB_0014ff27:
                          s->img_buffer = puVar28 + 1;
                          uVar9 = *puVar28;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar35 = (*(s->io).read)(s->io_user_data,(char *)psVar30,s->buflen);
                            if (iVar35 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar30;
                              s->img_buffer_end = local_88c8;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar30;
                              s->img_buffer_end = psVar30 + iVar35;
                            }
                            puVar28 = s->img_buffer;
                            goto LAB_0014ff27;
                          }
                          uVar9 = '\0';
                        }
                        data_01[(long)iVar34 + 2] = uVar9;
                        puVar28 = s->img_buffer;
                        if (puVar28 < s->img_buffer_end) {
LAB_0014ffb3:
                          s->img_buffer = puVar28 + 1;
                          uVar9 = *puVar28;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar35 = (*(s->io).read)(s->io_user_data,(char *)psVar30,s->buflen);
                            if (iVar35 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar30;
                              s->img_buffer_end = local_88c8;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar30;
                              s->img_buffer_end = psVar30 + iVar35;
                            }
                            puVar28 = s->img_buffer;
                            goto LAB_0014ffb3;
                          }
                          uVar9 = '\0';
                        }
                        data_01[(long)iVar34 + 1] = uVar9;
                        puVar28 = s->img_buffer;
                        if (puVar28 < s->img_buffer_end) {
LAB_0015003c:
                          s->img_buffer = puVar28 + 1;
                          uVar9 = *puVar28;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar35 = (*(s->io).read)(s->io_user_data,(char *)psVar30,s->buflen);
                            if (iVar35 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar30;
                              s->img_buffer_end = local_88c8;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar30;
                              s->img_buffer_end = psVar30 + iVar35;
                            }
                            puVar28 = s->img_buffer;
                            goto LAB_0015003c;
                          }
                          uVar9 = '\0';
                        }
                        data_01[iVar34] = uVar9;
                        bVar8 = 0xff;
                        if ((char)local_88d8 != '\0') {
                          pbVar21 = s->img_buffer;
                          if (s->img_buffer_end <= pbVar21) {
                            if (s->read_from_callbacks == 0) {
                              bVar8 = 0;
                              goto LAB_001500e1;
                            }
                            iVar35 = (*(s->io).read)(s->io_user_data,(char *)psVar30,s->buflen);
                            if (iVar35 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar30;
                              s->img_buffer_end = local_88c8;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar30;
                              s->img_buffer_end = psVar30 + iVar35;
                            }
                            pbVar21 = s->img_buffer;
                          }
                          s->img_buffer = pbVar21 + 1;
                          bVar8 = *pbVar21;
                        }
LAB_001500e1:
                        iVar35 = iVar34 + 3;
                        if (iVar10 == 4) {
                          data_01[(long)iVar34 + 3] = bVar8;
                          iVar35 = iVar34 + 4;
                        }
                        iVar34 = iVar35;
                        local_8930 = local_8930 | bVar8;
                        iVar39 = iVar39 + 1;
                      } while (iVar39 < (int)s->img_x);
                    }
                  }
                  else if (0 < (int)s->img_x) {
                    iVar39 = 0;
                    do {
                      uVar12 = stbi__get16le(s);
                      if (local_8908.bpp != 0x10) {
                        iVar35 = stbi__get16le(s);
                        uVar12 = uVar12 | iVar35 << 0x10;
                      }
                      iVar35 = stbi__shiftsigned(uVar12 & (uint)local_88e0,iVar40,uVar45);
                      data_01[iVar34] = (uchar)iVar35;
                      iVar35 = stbi__shiftsigned(uVar12 & local_8908.mg,iVar37,uVar23);
                      data_01[(long)iVar34 + 1] = (uchar)iVar35;
                      iVar35 = stbi__shiftsigned(uVar12 & local_8908.mb,local_893c,local_8924);
                      data_01[(long)iVar34 + 2] = (uchar)iVar35;
                      if (local_8908.ma == 0) {
                        uVar12 = 0xff;
                      }
                      else {
                        uVar12 = stbi__shiftsigned(uVar12 & local_8908.ma,(int)local_88c0,local_890c
                                                  );
                      }
                      iVar35 = iVar34 + 3;
                      if (iVar10 == 4) {
                        data_01[(long)iVar34 + 3] = (uchar)uVar12;
                        iVar35 = iVar34 + 4;
                      }
                      iVar34 = iVar35;
                      local_8930 = local_8930 | uVar12;
                      iVar39 = iVar39 + 1;
                    } while (iVar39 < (int)s->img_x);
                  }
                  stbi__skip(s,local_88b0);
                  iVar39 = local_88ac + 1;
                  uVar26 = (ulong)local_88cc;
                } while (iVar39 < (int)s->img_y);
                bVar46 = true;
              }
            }
            else {
              if ((local_8908.mg != 0 && local_8908.mr != 0) && local_8908.mb != 0) {
                iVar40 = stbi__high_bit(local_8908.mr);
                iVar40 = iVar40 + -7;
                uVar45 = (local_8908.mr >> 1 & 0x55555555) + (local_8908.mr & 0x55555555);
                uVar45 = (uVar45 >> 2 & 0x33333333) + (uVar45 & 0x33333333);
                uVar45 = (uVar45 >> 4) + uVar45 & 0xf0f0f0f;
                uVar45 = (uVar45 >> 8) + uVar45;
                local_88e0 = (int *)CONCAT44(local_88e0._4_4_,local_8908.mr);
                uVar45 = (uVar45 >> 0x10) + uVar45 & 0xff;
                iVar37 = stbi__high_bit(local_8908.mg);
                iVar37 = iVar37 + -7;
                uVar23 = (local_8908.mg >> 1 & 0x55555555) + (local_8908.mg & 0x55555555);
                uVar23 = (uVar23 >> 2 & 0x33333333) + (uVar23 & 0x33333333);
                uVar23 = (uVar23 >> 4) + uVar23 & 0xf0f0f0f;
                uVar23 = (uVar23 >> 8) + uVar23;
                uVar23 = (uVar23 >> 0x10) + uVar23 & 0xff;
                local_893c = stbi__high_bit(local_8908.mb);
                local_893c = local_893c + -7;
                uVar12 = (local_8908.mb >> 1 & 0x55555555) + (local_8908.mb & 0x55555555);
                uVar12 = (uVar12 >> 2 & 0x33333333) + (uVar12 & 0x33333333);
                uVar12 = (uVar12 >> 4) + uVar12 & 0xf0f0f0f;
                uVar12 = (uVar12 >> 8) + uVar12;
                local_8924 = (uVar12 >> 0x10) + uVar12 & 0xff;
                iVar39 = stbi__high_bit(local_8908.ma);
                uVar26 = (ulong)local_88cc;
                local_88c0 = CONCAT44(local_88c0._4_4_,iVar39 + -7);
                uVar12 = (local_8908.ma >> 1 & 0x55555555) + (local_8908.ma & 0x55555555);
                uVar12 = (uVar12 >> 2 & 0x33333333) + (uVar12 & 0x33333333);
                uVar12 = (uVar12 >> 4) + uVar12 & 0xf0f0f0f;
                uVar12 = (uVar12 >> 8) + uVar12;
                local_890c = (uVar12 >> 0x10) + uVar12 & 0xff;
                local_8908.mr = (uint)local_88e0;
                goto LAB_0014fd81;
              }
              free(data_01);
              stbi__g_failure_reason = "bad masks";
              bVar46 = false;
            }
            if (!bVar46) goto LAB_0014d16a;
          }
          piVar43 = local_88e8;
          if (((iVar10 == 4) && (local_8930 == 0)) &&
             (iVar40 = s->img_x * s->img_y * 4, -1 < iVar40 + -1)) {
            lVar15 = (ulong)(iVar40 - 4) + 7;
            do {
              data_01[lVar15 + -4] = 0xff;
              lVar15 = lVar15 + -4;
            } while (3 < lVar15);
          }
          if (0 < (int)local_88b4) {
            uVar45 = (int)s->img_y >> 1;
            if (0 < (int)uVar45) {
              uVar12 = s->img_x * iVar10;
              uVar23 = (s->img_y - 1) * uVar12;
              uVar26 = 0;
              uVar27 = 0;
              do {
                if (0 < (int)uVar12) {
                  uVar38 = 0;
                  do {
                    uVar9 = data_01[uVar38 + uVar26];
                    data_01[uVar38 + uVar26] = data_01[uVar38 + uVar23];
                    data_01[uVar38 + uVar23] = uVar9;
                    uVar38 = uVar38 + 1;
                  } while (uVar12 != uVar38);
                }
                uVar27 = uVar27 + 1;
                uVar23 = uVar23 - uVar12;
                uVar26 = (ulong)((int)uVar26 + uVar12);
              } while (uVar27 != uVar45);
            }
          }
          if (((req_comp == 0) || (iVar10 == req_comp)) ||
             (data_01 = stbi__convert_format(data_01,iVar10,req_comp,s->img_x,s->img_y),
             data_01 != (uchar *)0x0)) {
            *x = s->img_x;
            *y = s->img_y;
            if (piVar43 == (int *)0x0) {
              return data_01;
            }
            *piVar43 = s->img_n;
            return data_01;
          }
        }
      }
    }
    else {
      if (s->read_from_callbacks != 0) {
        psVar29 = s->buffer_start;
        iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar29,s->buflen);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar29;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar29;
          s->img_buffer_end = psVar29 + iVar10;
        }
        psVar29 = s->img_buffer;
        goto LAB_0014e8ff;
      }
LAB_0014eb39:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar10 = stbi__gif_test(s);
      if (iVar10 != 0) {
        memset(&local_88a8,0,0x8870);
        psVar16 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,local_88e8,0,psVar30);
        if (psVar16 == s) {
          psVar16 = (stbi__context *)0x0;
        }
        psVar19 = (stbi__context *)0x0;
        if (psVar16 != (stbi__context *)0x0) {
          *x = local_88a8.w;
          *y = local_88a8.h;
          psVar19 = psVar16;
          if ((req_comp & 0xfffffffbU) != 0) {
            psVar19 = (stbi__context *)
                      stbi__convert_format((uchar *)psVar16,4,req_comp,local_88a8.w,local_88a8.h);
          }
        }
        free(local_88a8.history);
        psVar14 = (stbi__jpeg *)local_88a8.background;
        goto LAB_0014f769;
      }
      iVar10 = stbi__psd_test(s);
      if (iVar10 != 0) {
        pvVar17 = stbi__psd_load(s,x,y,local_88e8,req_comp,ri,bpc);
        return pvVar17;
      }
      iVar10 = stbi__pic_test(s);
      piVar43 = local_88e8;
      if (iVar10 != 0) {
        pvVar17 = stbi__pic_load(s,x,y,local_88e8,req_comp,ri_00);
        return pvVar17;
      }
      iVar10 = stbi__pnm_test(s);
      if (iVar10 != 0) {
        pvVar17 = stbi__pnm_load(s,x,y,piVar43,req_comp,ri_00);
        return pvVar17;
      }
      iVar10 = stbi__hdr_test(s);
      if (iVar10 != 0) {
        data_02 = stbi__hdr_load(s,x,y,piVar43,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *piVar43;
        }
        psVar30 = stbi__hdr_to_ldr(data_02,*x,*y,req_comp);
        return psVar30;
      }
      iVar10 = stbi__tga_test(s);
      if (iVar10 != 0) {
        pvVar17 = stbi__tga_load(s,x,y,piVar43,req_comp,ri_00);
        return pvVar17;
      }
      stbi__g_failure_reason = "unknown image type";
    }
LAB_0014d16a:
    psVar19 = (stbi__context *)0x0;
  }
  return psVar19;
LAB_0014e68a:
  iVar10 = 0;
LAB_0014e6a2:
  if (iVar10 == 0) goto LAB_0014f754;
  if (psVar14->marker != 0xff) goto LAB_0014e6b4;
LAB_0014e6c1:
  do {
    psVar16 = psVar14->s;
    if ((psVar16->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0014e6dd:
      if (psVar16->img_buffer_end <= psVar16->img_buffer) goto LAB_0014e6b4;
    }
    else {
      iVar10 = (*(psVar16->io).eof)(psVar16->io_user_data);
      if (iVar10 != 0) {
        if (psVar16->read_from_callbacks != 0) goto LAB_0014e6dd;
        goto LAB_0014e6b4;
      }
    }
    psVar16 = psVar14->s;
    psVar30 = psVar16->img_buffer;
    if (psVar16->img_buffer_end <= psVar30) {
      if (psVar16->read_from_callbacks == 0) goto LAB_0014e6c1;
      psVar30 = psVar16->buffer_start;
      iVar10 = (*(psVar16->io).read)(psVar16->io_user_data,(char *)psVar30,psVar16->buflen);
      if (iVar10 == 0) {
        psVar16->read_from_callbacks = 0;
        psVar16->img_buffer = psVar30;
        psVar16->img_buffer_end = psVar16->buffer_start + 1;
        psVar16->buffer_start[0] = '\0';
      }
      else {
        psVar16->img_buffer = psVar30;
        psVar16->img_buffer_end = psVar30 + iVar10;
      }
      psVar30 = psVar16->img_buffer;
    }
    psVar16->img_buffer = psVar30 + 1;
  } while (*psVar30 != 0xff);
  psVar16 = psVar14->s;
  psVar30 = psVar16->img_buffer;
  if (psVar30 < psVar16->img_buffer_end) {
LAB_0014e7df:
    psVar16->img_buffer = psVar30 + 1;
    sVar7 = *psVar30;
  }
  else {
    if (psVar16->read_from_callbacks != 0) {
      psVar30 = psVar16->buffer_start;
      iVar10 = (*(psVar16->io).read)(psVar16->io_user_data,(char *)psVar30,psVar16->buflen);
      if (iVar10 == 0) {
        psVar16->read_from_callbacks = 0;
        psVar16->img_buffer = psVar30;
        psVar16->img_buffer_end = psVar16->buffer_start + 1;
        psVar16->buffer_start[0] = '\0';
      }
      else {
        psVar16->img_buffer = psVar30;
        psVar16->img_buffer_end = psVar30 + iVar10;
      }
      psVar30 = psVar16->img_buffer;
      goto LAB_0014e7df;
    }
    sVar7 = '\0';
  }
  psVar14->marker = sVar7;
LAB_0014e6b4:
  bVar8 = stbi__get_marker(psVar14);
  goto LAB_0014d1fe;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}